

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiFab.cpp
# Opt level: O1

Real amrex::MultiFab::Dot
               (iMultiFab *mask,MultiFab *x,int xcomp,MultiFab *y,int ycomp,int numcomp,int nghost,
               bool local)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  MFIter mfi;
  Real local_220;
  Box local_16c;
  Array4<const_double> local_150;
  Array4<const_double> local_110;
  Array4<const_int> local_d0;
  MFIter local_90;
  
  MFIter::MFIter(&local_90,(FabArrayBase *)x,true);
  local_220 = 0.0;
  if (local_90.currentIndex < local_90.endIndex) {
    local_220 = 0.0;
    do {
      MFIter::growntilebox(&local_16c,&local_90,nghost);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_110,&x->super_FabArray<amrex::FArrayBox>,&local_90);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_150,&y->super_FabArray<amrex::FArrayBox>,&local_90);
      FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                (&local_d0,&mask->super_FabArray<amrex::IArrayBox>,&local_90);
      if (0 < numcomp) {
        lVar1 = (long)local_16c.smallend.vect[2];
        lVar10 = (long)local_16c.smallend.vect[1];
        lVar5 = (long)local_16c.smallend.vect[0];
        lVar13 = (long)ycomp * 8 * local_150.nstride +
                 (lVar10 - local_150.begin.y) * local_150.jstride * 8 +
                 (lVar1 - local_150.begin.z) * local_150.kstride * 8 + lVar5 * 8 +
                 (long)local_150.begin.x * -8 + (long)local_150.p;
        lVar11 = (long)xcomp * 8 * local_110.nstride +
                 (lVar10 - local_110.begin.y) * local_110.jstride * 8 +
                 (lVar1 - local_110.begin.z) * local_110.kstride * 8 + lVar5 * 8 +
                 (long)local_110.begin.x * -8 + (long)local_110.p;
        uVar3 = 0;
        do {
          lVar2 = lVar13;
          lVar7 = (lVar10 - local_d0.begin.y) * local_d0.jstride * 4 +
                  (lVar1 - local_d0.begin.z) * local_d0.kstride * 4 + lVar5 * 4 +
                  (long)local_d0.begin.x * -4 + (long)local_d0.p;
          lVar9 = lVar1;
          lVar12 = lVar11;
          if (local_16c.smallend.vect[2] <= local_16c.bigend.vect[2]) {
            do {
              lVar4 = lVar10;
              lVar6 = lVar7;
              lVar8 = lVar2;
              lVar14 = lVar12;
              if (local_16c.smallend.vect[1] <= local_16c.bigend.vect[1]) {
                do {
                  if (local_16c.smallend.vect[0] <= local_16c.bigend.vect[0]) {
                    lVar15 = 0;
                    do {
                      if (*(int *)(lVar6 + lVar15 * 4) != 0) {
                        local_220 = local_220 +
                                    *(double *)(lVar14 + lVar15 * 8) *
                                    *(double *)(lVar8 + lVar15 * 8);
                      }
                      lVar15 = lVar15 + 1;
                    } while ((local_16c.bigend.vect[0] - local_16c.smallend.vect[0]) + 1 !=
                             (int)lVar15);
                  }
                  lVar4 = lVar4 + 1;
                  lVar8 = lVar8 + local_150.jstride * 8;
                  lVar14 = lVar14 + local_110.jstride * 8;
                  lVar6 = lVar6 + local_d0.jstride * 4;
                } while (local_16c.bigend.vect[1] + 1 != (int)lVar4);
              }
              lVar9 = lVar9 + 1;
              lVar2 = lVar2 + local_150.kstride * 8;
              lVar12 = lVar12 + local_110.kstride * 8;
              lVar7 = lVar7 + local_d0.kstride * 4;
            } while (local_16c.bigend.vect[2] + 1 != (int)lVar9);
          }
          uVar3 = uVar3 + 1;
          lVar13 = lVar13 + local_150.nstride * 8;
          lVar11 = lVar11 + local_110.nstride * 8;
        } while (uVar3 != (uint)numcomp);
      }
      MFIter::operator++(&local_90);
    } while (local_90.currentIndex < local_90.endIndex);
  }
  MFIter::~MFIter(&local_90);
  return local_220;
}

Assistant:

Real
MultiFab::Dot (const iMultiFab& mask,
               const MultiFab& x, int xcomp,
               const MultiFab& y, int ycomp,
               int numcomp, int nghost, bool local)
{
    BL_ASSERT(x.boxArray() == y.boxArray());
    BL_ASSERT(x.boxArray() == mask.boxArray());
    BL_ASSERT(x.DistributionMap() == y.DistributionMap());
    BL_ASSERT(x.DistributionMap() == mask.DistributionMap());
    BL_ASSERT(x.nGrow() >= nghost && y.nGrow() >= nghost);
    BL_ASSERT(mask.nGrow() >= nghost);

    Real sm = Real(0.0);
#ifdef AMREX_USE_GPU
    if (Gpu::inLaunchRegion()) {
        auto const& xma = x.const_arrays();
        auto const& yma = y.const_arrays();
        auto const& mma = mask.const_arrays();
        sm = ParReduce(TypeList<ReduceOpSum>{}, TypeList<Real>{}, x, IntVect(nghost),
        [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k) noexcept -> GpuTuple<Real>
        {
            Real t = Real(0.0);
            if (mma[box_no](i,j,k)) {
                auto const& xfab = xma[box_no];
                auto const& yfab = yma[box_no];
                for (int n = 0; n < numcomp; ++n) {
                    t += xfab(i,j,k,xcomp+n) * yfab(i,j,k,ycomp+n);
                }
            }
            return t;
        });
    } else
#endif
    {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (!system::regtest_reduction) reduction(+:sm)
#endif
        for (MFIter mfi(x,true); mfi.isValid(); ++mfi)
        {
            Box const& bx = mfi.growntilebox(nghost);
            Array4<Real const> const& xfab = x.const_array(mfi);
            Array4<Real const> const& yfab = y.const_array(mfi);
            Array4<int const> const& mfab = mask.const_array(mfi);
            AMREX_LOOP_4D(bx, numcomp, i, j, k, n,
            {
                if (mfab(i,j,k)) {
                    sm += xfab(i,j,k,xcomp+n) * yfab(i,j,k,ycomp+n);
                }
            });
        }
    }

    if (!local) {
        ParallelAllReduce::Sum(sm, ParallelContext::CommunicatorSub());
    }

    return sm;
}